

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int __thiscall geemuboi::core::CPU::jp_nz_a16(CPU *this)

{
  Registers *pRVar1;
  int iVar2;
  
  pRVar1 = this->regs;
  if (-1 < (char)pRVar1->f) {
    iVar2 = (*this->mmu->_vptr_IMmu[1])(this->mmu,(ulong)pRVar1->pc);
    this->regs->pc = (uint16_t)iVar2;
    return 4;
  }
  pRVar1->pc = pRVar1->pc + 2;
  return 3;
}

Assistant:

int CPU::jp_nz_a16() {
    if (!(regs.f & 0x80)) {
        regs.pc = mmu.read_word(regs.pc);
        return 4;
    } else {
        regs.pc += 2;
        return 3;
    }
}